

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

type_t pugi::impl::anon_unknown_0::xpath_sort
                 (xpath_node *begin,xpath_node *end,type_t type,bool rev)

{
  xpath_node *lhs;
  xml_node_struct *pxVar1;
  xml_attribute_struct *pxVar2;
  xml_attribute_struct *pxVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  undefined7 in_register_00000009;
  document_order_comparator *pred;
  xpath_node *extraout_RDX;
  xpath_node *pxVar7;
  xpath_node *extraout_RDX_00;
  type_t tVar8;
  xpath_node *this;
  
  pred = (document_order_comparator *)(ulong)type;
  if (type == type_unsorted) {
    pred = (document_order_comparator *)0x1;
    if (0x10 < (long)end - (long)begin) {
      bVar4 = document_order_comparator::operator()
                        ((document_order_comparator *)begin,begin + 1,(xpath_node *)0x1);
      pxVar7 = extraout_RDX;
      this = begin + 1;
      do {
        lhs = this + 1;
        if (end <= lhs) break;
        bVar5 = document_order_comparator::operator()((document_order_comparator *)this,lhs,pxVar7);
        pxVar7 = extraout_RDX_00;
        this = lhs;
      } while (bVar4 == bVar5);
      pred = (document_order_comparator *)0x0;
      if (end <= lhs) {
        pred = (document_order_comparator *)(ulong)(2 - bVar4);
      }
    }
    if ((int)pred == 0) {
      (anonymous_namespace)::
      sort<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
                (begin,end,pred);
      pred = (document_order_comparator *)0x1;
    }
  }
  tVar8 = (int)CONCAT71(in_register_00000009,rev) + type_sorted;
  lVar6 = (long)end - (long)begin;
  if ((0x10 < lVar6) && ((type_t)pred != tVar8)) {
    pxVar7 = end + -1;
    do {
      pxVar1 = (begin->_node)._root;
      pxVar2 = (begin->_attribute)._attr;
      pxVar3 = (pxVar7->_attribute)._attr;
      (begin->_node)._root = (pxVar7->_node)._root;
      (begin->_attribute)._attr = pxVar3;
      begin = begin + 1;
      (pxVar7->_node)._root = pxVar1;
      (pxVar7->_attribute)._attr = pxVar2;
      lVar6 = lVar6 + -0x20;
      pxVar7 = pxVar7 + -1;
    } while (0x10 < lVar6);
  }
  return tVar8;
}

Assistant:

PUGI__FN xpath_node_set::type_t xpath_sort(xpath_node* begin, xpath_node* end, xpath_node_set::type_t type, bool rev)
	{
		xpath_node_set::type_t order = rev ? xpath_node_set::type_sorted_reverse : xpath_node_set::type_sorted;

		if (type == xpath_node_set::type_unsorted)
		{
			xpath_node_set::type_t sorted = xpath_get_order(begin, end);

			if (sorted == xpath_node_set::type_unsorted)
			{
				sort(begin, end, document_order_comparator());

				type = xpath_node_set::type_sorted;
			}
			else
				type = sorted;
		}

		if (type != order) reverse(begin, end);

		return order;
	}